

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_short_test.c
# Opt level: O0

void float_to_int_test(void)

{
  uint local_c;
  int k;
  
  printf("\tfloat_to_int_test ............................... ");
  src_float_to_int_array(float_to_int_test::fpos,float_to_int_test::out,10);
  local_c = 0;
  while( true ) {
    if (9 < (int)local_c) {
      src_float_to_int_array(float_to_int_test::fneg,float_to_int_test::out,10);
      local_c = 0;
      while( true ) {
        if (9 < (int)local_c) {
          puts("ok");
          return;
        }
        if (-0x7530000 < float_to_int_test::out[(int)local_c]) break;
        local_c = local_c + 1;
      }
      printf("\n\n\tLine %d : out [%d] == %d\n",0x99,(ulong)local_c,
             (ulong)(uint)float_to_int_test::out[(int)local_c]);
      exit(1);
    }
    if (float_to_int_test::out[(int)local_c] < 0x75300000) break;
    local_c = local_c + 1;
  }
  printf("\n\n\tLine %d : out [%d] == %d\n",0x91,(ulong)local_c,
         (ulong)(uint)float_to_int_test::out[(int)local_c]);
  exit(1);
}

Assistant:

static void
float_to_int_test (void)
{
	static float fpos [] =
	{	0.95f, 0.99f, 1.0f, 1.01f, 1.1f, 2.0f, 11.1f, 111.1f, 2222.2f, 33333.3f
		} ;
	static float fneg [] =
	{	-0.95f, -0.99f, -1.0f, -1.01f, -1.1f, -2.0f, -11.1f, -111.1f, -2222.2f, -33333.3f
		} ;

	static int out [MAX (ARRAY_LEN (fpos), ARRAY_LEN (fneg))] ;

	int k ;

	printf ("\tfloat_to_int_test ............................... ") ;

	src_float_to_int_array (fpos, out, ARRAY_LEN (fpos)) ;

	for (k = 0 ; k < ARRAY_LEN (fpos) ; k++)
		if (out [k] < 30000 * 0x10000)
		{	printf ("\n\n\tLine %d : out [%d] == %d\n", __LINE__, k, out [k]) ;
			exit (1) ;
			} ;

	src_float_to_int_array (fneg, out, ARRAY_LEN (fneg)) ;

	for (k = 0 ; k < ARRAY_LEN (fneg) ; k++)
		if (out [k] > -30000 * 0x1000)
		{	printf ("\n\n\tLine %d : out [%d] == %d\n", __LINE__, k, out [k]) ;
			exit (1) ;
			} ;

	puts ("ok") ;

	return ;
}